

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractslider.cpp
# Opt level: O0

bool __thiscall
QAbstractSliderPrivate::scrollByDelta
          (QAbstractSliderPrivate *this,Orientation orientation,KeyboardModifiers modifiers,
          int delta)

{
  Int IVar1;
  int iVar2;
  float fVar3;
  int iVar4;
  int in_ECX;
  int in_ESI;
  QAbstractSliderPrivate *in_RDI;
  long in_FS_OFFSET;
  int *piVar5;
  int prevValue;
  float effective_offset;
  qreal stepsToScrollF;
  qreal offset;
  int stepsToScroll;
  QAbstractSlider *q;
  KeyboardModifier in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 uVar6;
  undefined4 in_stack_ffffffffffffffa4;
  int local_44;
  int local_38;
  bool local_25;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_14;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  local_38 = in_ECX;
  if (in_ESI == 1) {
    local_38 = -in_ECX;
  }
  local_10.super_QFlagsStorage<Qt::KeyboardModifier>.i =
       (QFlagsStorage<Qt::KeyboardModifier>)
       QFlags<Qt::KeyboardModifier>::operator&
                 ((QFlags<Qt::KeyboardModifier> *)
                  CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                  in_stack_ffffffffffffff7c);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_10);
  uVar6 = true;
  if (IVar1 == 0) {
    local_14.super_QFlagsStorage<Qt::KeyboardModifier>.i =
         (QFlagsStorage<Qt::KeyboardModifier>)
         QFlags<Qt::KeyboardModifier>::operator&
                   ((QFlags<Qt::KeyboardModifier> *)
                    CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                    in_stack_ffffffffffffff7c);
    IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
    uVar6 = IVar1 != 0;
  }
  if ((bool)uVar6 == false) {
    iVar2 = QApplication::wheelScrollLines();
    piVar5 = (int *)((double)iVar2 * ((double)local_38 / 120.0));
    iVar2 = effectiveSingleStep(in_RDI);
    if (((in_RDI->offset_accumulated != 0.0) || (NAN(in_RDI->offset_accumulated))) &&
       (((double)local_38 / 120.0) / (double)in_RDI->offset_accumulated < 0.0)) {
      in_RDI->offset_accumulated = 0.0;
    }
    in_RDI->offset_accumulated =
         (float)((double)in_RDI->offset_accumulated + (double)piVar5 * (double)iVar2);
    piVar5 = qBound<int>((int *)CONCAT17(uVar6,in_stack_ffffffffffffff90),piVar5,
                         (int *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    local_44 = *piVar5;
    in_RDI->offset_accumulated = in_RDI->offset_accumulated - (float)(int)in_RDI->offset_accumulated
    ;
    if (local_44 == 0) {
      if (((byte)in_RDI->field_0x27c >> 4 & 1) == 0) {
        fVar3 = in_RDI->offset_accumulated;
      }
      else {
        fVar3 = -in_RDI->offset_accumulated;
      }
      if ((fVar3 <= 0.0) || (in_RDI->maximum <= in_RDI->value)) {
        if ((0.0 <= fVar3) || (in_RDI->value <= *(int *)&(in_RDI->super_QWidgetPrivate).field_0x254)
           ) {
          in_RDI->offset_accumulated = 0.0;
          local_25 = false;
        }
        else {
          local_25 = true;
        }
      }
      else {
        local_25 = true;
      }
      goto LAB_0050e0f6;
    }
  }
  else {
    piVar5 = qBound<int>((int *)CONCAT17(uVar6,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88,
                         (int *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    local_44 = *piVar5;
    in_RDI->offset_accumulated = 0.0;
  }
  if (((byte)in_RDI->field_0x27c >> 4 & 1) != 0) {
    local_44 = -local_44;
  }
  iVar2 = in_RDI->value;
  iVar4 = overflowSafeAdd(in_RDI,local_44);
  iVar4 = (**(code **)(*(long *)&in_RDI->super_QWidgetPrivate + 0xa8))(in_RDI,iVar4);
  in_RDI->position = iVar4;
  QAbstractSlider::triggerAction
            ((QAbstractSlider *)CONCAT44(in_stack_ffffffffffffffa4,iVar2),
             (SliderAction)((ulong)in_RDI >> 0x20));
  if (iVar2 == in_RDI->value) {
    in_RDI->offset_accumulated = 0.0;
    local_25 = false;
  }
  else {
    local_25 = true;
  }
LAB_0050e0f6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_25;
}

Assistant:

bool QAbstractSliderPrivate::scrollByDelta(Qt::Orientation orientation, Qt::KeyboardModifiers modifiers, int delta)
{
    Q_Q(QAbstractSlider);
    int stepsToScroll = 0;
    // in Qt scrolling to the right gives negative values.
    if (orientation == Qt::Horizontal)
        delta = -delta;
    qreal offset = qreal(delta) / 120;

    if ((modifiers & Qt::ControlModifier) || (modifiers & Qt::ShiftModifier)) {
        // Scroll one page regardless of delta:
        stepsToScroll = qBound(-pageStep, int(offset * pageStep), pageStep);
        offset_accumulated = 0;
    } else {
        // Calculate how many lines to scroll. Depending on what delta is (and
        // offset), we might end up with a fraction (e.g. scroll 1.3 lines). We can
        // only scroll whole lines, so we keep the reminder until next event.
        qreal stepsToScrollF =
#if QT_CONFIG(wheelevent)
                QApplication::wheelScrollLines() *
#endif
                offset * effectiveSingleStep();
        // Check if wheel changed direction since last event:
        if (offset_accumulated != 0 && (offset / offset_accumulated) < 0)
            offset_accumulated = 0;

        offset_accumulated += stepsToScrollF;

        // Don't scroll more than one page in any case:
        stepsToScroll = qBound(-pageStep, int(offset_accumulated), pageStep);

        offset_accumulated -= int(offset_accumulated);
        if (stepsToScroll == 0) {
            // We moved less than a line, but might still have accumulated partial scroll,
            // unless we already are at one of the ends.
            const float effective_offset = invertedControls ? -offset_accumulated : offset_accumulated;
            if (effective_offset > 0.f && value < maximum)
                return true;
            if (effective_offset < 0.f && value > minimum)
                return true;
            offset_accumulated = 0;
            return false;
        }
    }

    if (invertedControls)
        stepsToScroll = -stepsToScroll;

    int prevValue = value;
    position = bound(overflowSafeAdd(stepsToScroll)); // value will be updated by triggerAction()
    q->triggerAction(QAbstractSlider::SliderMove);

    if (prevValue == value) {
        offset_accumulated = 0;
        return false;
    }
    return true;
}